

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_pole_digital_filter.cc
# Opt level: O2

bool __thiscall
sptk::AllPoleDigitalFilter::Run
          (AllPoleDigitalFilter *this,vector<double,_std::allocator<double>_> *filter_coefficients,
          double filter_input,double *filter_output,Buffer *buffer)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  double *pdVar4;
  double *pdVar5;
  uint uVar6;
  double *pdVar7;
  long lVar8;
  ulong uVar9;
  size_type __new_size;
  long lVar10;
  double dVar11;
  
  if (this->is_valid_ == true) {
    bVar3 = false;
    if ((buffer != (Buffer *)0x0) && (bVar3 = false, filter_output != (double *)0x0)) {
      pdVar5 = (filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = this->num_filter_order_;
      __new_size = (size_type)(int)uVar6;
      bVar3 = false;
      if ((long)(filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar5 >> 3 == __new_size + 1) {
        pdVar4 = (buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((long)(buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar4 >> 3 != __new_size) {
          std::vector<double,_std::allocator<double>_>::resize(&buffer->d_,__new_size);
          pdVar5 = (buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          pdVar4 = (buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          for (pdVar7 = pdVar4; pdVar7 != pdVar5; pdVar7 = pdVar7 + 1) {
            *pdVar7 = 0.0;
          }
          pdVar5 = (filter_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          uVar6 = this->num_filter_order_;
        }
        dVar11 = filter_input * *pdVar5;
        if (uVar6 != 0) {
          if (this->transposition_ == false) {
            for (uVar9 = (ulong)uVar6; 1 < (int)uVar9; uVar9 = uVar9 - 1) {
              dVar1 = pdVar5[uVar9];
              dVar2 = pdVar4[uVar9 - 1];
              pdVar4[uVar9 - 1] = pdVar4[uVar9 - 2];
              dVar11 = dVar11 - dVar1 * dVar2;
            }
            dVar11 = dVar11 - pdVar5[1] * *pdVar4;
            *pdVar4 = dVar11;
          }
          else {
            dVar11 = dVar11 - *pdVar4;
            lVar8 = (long)(int)uVar6;
            for (lVar10 = 1; lVar10 < lVar8; lVar10 = lVar10 + 1) {
              pdVar4[lVar10 + -1] = pdVar5[lVar10] * dVar11 + pdVar4[lVar10];
            }
            pdVar4[lVar8 + -1] = pdVar5[lVar8] * dVar11;
          }
        }
        *filter_output = dVar11;
        bVar3 = true;
      }
    }
    return bVar3;
  }
  return false;
}

Assistant:

bool AllPoleDigitalFilter::Run(const std::vector<double>& filter_coefficients,
                               double filter_input, double* filter_output,
                               AllPoleDigitalFilter::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ ||
      filter_coefficients.size() !=
          static_cast<std::size_t>(num_filter_order_ + 1) ||
      NULL == filter_output || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (buffer->d_.size() != static_cast<std::size_t>(num_filter_order_)) {
    buffer->d_.resize(num_filter_order_);
    std::fill(buffer->d_.begin(), buffer->d_.end(), 0.0);
  }

  const double gained_input(filter_input * filter_coefficients[0]);
  if (0 == num_filter_order_) {
    *filter_output = gained_input;
    return true;
  }

  const double* a(&(filter_coefficients[1]));
  double* d(&buffer->d_[0]);
  double sum(gained_input);

  // Apply all-pole filter.
  if (transposition_) {
    sum -= d[0];
    for (int m(1); m < num_filter_order_; ++m) {
      d[m - 1] = d[m] + a[m - 1] * sum;
    }
    d[num_filter_order_ - 1] = a[num_filter_order_ - 1] * sum;
  } else {
    for (int m(num_filter_order_ - 1); 0 < m; --m) {
      sum -= a[m] * d[m];
      d[m] = d[m - 1];
    }
    sum -= a[0] * d[0];
    d[0] = sum;
  }

  // Save result.
  *filter_output = sum;

  return true;
}